

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_get.c
# Opt level: O2

int mpt_config_query(mpt_config *conf,mpt_path *path,mpt_config_handler_t *cb,void *ctx)

{
  int iVar1;
  mpt_metatype *pmVar2;
  mpt_config *local_30;
  
  local_30 = conf;
  if (conf == (mpt_config *)0x0) {
    pmVar2 = mpt_config_global((mpt_path *)0x0);
    if (pmVar2 == (mpt_metatype *)0x0) {
      return 0;
    }
    iVar1 = (*(pmVar2->_vptr->convertable).convert)((mpt_convertable *)pmVar2,0x85,&local_30);
    if (local_30 == (mpt_config *)0x0 || iVar1 < 0) {
      return 0;
    }
  }
  iVar1 = (*local_30->_vptr->query)(local_30,path,cb,ctx);
  return iVar1;
}

Assistant:

extern int mpt_config_query(const MPT_INTERFACE(config) *conf, const MPT_STRUCT(path) *path, MPT_TYPE(config_handler) cb, void *ctx)
{
	if (!conf) {
		MPT_INTERFACE(metatype) *mt;
		
		if (!(mt = mpt_config_global(0))
		 || (MPT_metatype_convert(mt, MPT_ENUM(TypeConfigPtr), &conf) < 0)
		 || !conf) {
			return 0;
		}
	}
	return conf->_vptr->query(conf, path, cb, ctx);
}